

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestQueue.cpp
# Opt level: O3

void anon_unknown.dwarf_1dea69::readq(QueueReader *r,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Result *in_R9;
  ulong uVar4;
  size_t local_58;
  ExpressionDecomposer local_4c;
  Result local_48;
  Expression_lhs<unsigned_long> local_28;
  
  uVar4 = (r->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i;
  uVar1 = (r->_queue->readIndex).super___atomic_base<unsigned_long>._M_i;
  r->_readEnd = uVar4;
  if (uVar4 < uVar1) {
    uVar2 = r->_queue->dataEnd;
    uVar3 = uVar2 - uVar1;
    if (uVar2 < uVar1 || uVar3 == 0) {
      uVar3 = uVar4;
      uVar4 = 0;
    }
  }
  else {
    uVar3 = uVar4 - uVar1;
    uVar4 = 0;
  }
  local_58 = size;
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4c,DT_CHECK);
  local_28.m_at = local_4c.m_at;
  local_28.lhs = uVar4 + uVar3;
  doctest::detail::Expression_lhs<unsigned_long>::operator>=(&local_48,&local_28,&local_58);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1bb7e0,(char *)0x1b,0x1bb9c0,&local_48.m_passed,in_R9);
  doctest::String::~String(&local_48.m_decomp);
  (r->_queue->readIndex).super___atomic_base<unsigned_long>._M_i = r->_readEnd;
  return;
}

Assistant:

void readq(binlog::detail::QueueReader& r, std::size_t size)
{
  const auto rr = r.beginRead();
  CHECK(rr.size1 + rr.size2 >= size);
  r.endRead();
}